

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_server.cpp
# Opt level: O1

bool __thiscall
HawkTracer::TCPServer::start
          (TCPServer *this,int port,OnClientConnected client_connected,void *user_data)

{
  int iVar1;
  int optval;
  sockaddr_in serveraddr;
  long *local_50;
  thread local_48;
  undefined4 local_3c;
  sockaddr local_38;
  
  if (this->_sock_fd != -1) {
    stop(this);
  }
  iVar1 = socket(2,1,0);
  this->_sock_fd = iVar1;
  if (-1 < iVar1) {
    local_3c = 1;
    iVar1 = setsockopt(iVar1,1,2,&local_3c,4);
    if (iVar1 == 0) {
      local_38.sa_data[6] = '\0';
      local_38.sa_data[7] = '\0';
      local_38.sa_data[8] = '\0';
      local_38.sa_data[9] = '\0';
      local_38.sa_data[10] = '\0';
      local_38.sa_data[0xb] = '\0';
      local_38.sa_data[0xc] = '\0';
      local_38.sa_data[0xd] = '\0';
      local_38.sa_data._0_2_ = (ushort)port << 8 | (ushort)port >> 8;
      local_38.sa_family = 2;
      local_38.sa_data._2_4_ = 0;
      iVar1 = bind(this->_sock_fd,&local_38,0x10);
      if ((-1 < iVar1) && (iVar1 = listen(this->_sock_fd,5), -1 < iVar1)) {
        local_48._M_id._M_thread = (id)0;
        local_50 = (long *)operator_new(0x20);
        *local_50 = (long)&PTR___State_0010bd60;
        local_50[1] = (long)this;
        local_50[2] = (long)client_connected;
        local_50[3] = (long)user_data;
        std::thread::_M_start_thread(&local_48,&local_50,0);
        if (local_50 != (long *)0x0) {
          (**(code **)(*local_50 + 8))();
        }
        if ((this->_accept_client_thread)._M_id._M_thread == 0) {
          (this->_accept_client_thread)._M_id._M_thread =
               (native_handle_type)local_48._M_id._M_thread;
          return true;
        }
        std::terminate();
      }
    }
    stop(this);
  }
  return false;
}

Assistant:

bool TCPServer::start(int port, OnClientConnected client_connected, void* user_data)
{
    if (is_running())
    {
        stop();
    }
#ifdef _WIN32
    WSADATA wsaData;
    if (WSAStartup(MAKEWORD(2, 2), &wsaData) != 0)
    {
        return false;
    }
#endif
    _sock_fd = socket(AF_INET, SOCK_STREAM, 0);

    if (_sock_fd < 0)
    {
        return false;
    }

#ifndef _WIN32
    int optval = 1;
    if (setsockopt(_sock_fd, SOL_SOCKET, SO_REUSEADDR, (const void *)&optval , sizeof(int)) != 0)
    {
        stop();
        return false;
    }
#endif

    sockaddr_in serveraddr;
    memset((char *) &serveraddr, 0, sizeof(serveraddr));
    serveraddr.sin_family = AF_INET;
    serveraddr.sin_addr.s_addr = htonl(INADDR_ANY);
    serveraddr.sin_port = htons((unsigned short)port);

    if (bind(_sock_fd, (struct sockaddr *) &serveraddr, sizeof(serveraddr)) < 0)
    {
        stop();
        return false;
    }

    if (listen(_sock_fd, 5) < 0)
    {
        stop();
        return false;
    }

    _accept_client_thread = std::thread([this, client_connected, user_data]
    {
        _run(client_connected, user_data);
    });

    return true;
}